

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O2

void aom_highbd_comp_avg_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,int bd,int subpel_search)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  ulong uVar6;
  
  aom_highbd_upsampled_pred_sse2
            (xd,cm,mi_row,mi_col,mv,comp_pred8,width,height,subpel_x_q3,subpel_y_q3,ref8,ref_stride,
             bd,subpel_search);
  uVar4 = height * width >> 3;
  uVar3 = 0;
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar6 = uVar3;
  }
  while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
    puVar1 = (undefined2 *)(uVar3 + (long)comp_pred8 * 2);
    puVar2 = (undefined2 *)(uVar3 + (long)pred8 * 2);
    uVar7 = pavgw(*puVar2,*puVar1);
    uVar8 = pavgw(puVar2[1],puVar1[1]);
    uVar9 = pavgw(puVar2[2],puVar1[2]);
    uVar10 = pavgw(puVar2[3],puVar1[3]);
    uVar11 = pavgw(puVar2[4],puVar1[4]);
    uVar12 = pavgw(puVar2[5],puVar1[5]);
    uVar13 = pavgw(puVar2[6],puVar1[6]);
    uVar14 = pavgw(puVar2[7],puVar1[7]);
    puVar1 = (undefined2 *)(uVar3 + (long)comp_pred8 * 2);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1[2] = uVar9;
    puVar1[3] = uVar10;
    puVar1[4] = uVar11;
    puVar1[5] = uVar12;
    puVar1[6] = uVar13;
    puVar1[7] = uVar14;
    uVar3 = uVar3 + 0x10;
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_upsampled_pred_sse2(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, int bd, int subpel_search) {
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *comp_pred16 = CONVERT_TO_SHORTPTR(comp_pred8);
  /*The total number of pixels must be a multiple of 8 (e.g., 4x4).*/
  assert(!(width * height & 7));
  int n = width * height >> 3;
  for (int i = 0; i < n; i++) {
    __m128i s0 = _mm_loadu_si128((const __m128i *)comp_pred16);
    __m128i p0 = _mm_loadu_si128((const __m128i *)pred);
    _mm_storeu_si128((__m128i *)comp_pred16, _mm_avg_epu16(s0, p0));
    comp_pred16 += 8;
    pred += 8;
  }
}